

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dce.cpp
# Opt level: O0

void __thiscall
spvtools::opt::VectorDCE::MarkDebugValueUsesAsDead
          (VectorDCE *this,Instruction *composite,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *dead_dbg_value)

{
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *def;
  IRContext *this_00;
  DefUseManager *this_01;
  anon_class_8_1_de80817e local_48;
  function<void_(spvtools::opt::Instruction_*)> local_40;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *local_20;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  *dead_dbg_value_local;
  Instruction *composite_local;
  VectorDCE *this_local;
  
  local_20 = dead_dbg_value;
  dead_dbg_value_local =
       (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
       composite;
  composite_local = (Instruction *)this;
  this_00 = Pass::context((Pass *)this);
  this_01 = IRContext::get_def_use_mgr(this_00);
  def = dead_dbg_value_local;
  local_48.dead_dbg_value = &local_20;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::VectorDCE::MarkDebugValueUsesAsDead(spvtools::opt::Instruction*,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>*)::__0,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_40,&local_48);
  analysis::DefUseManager::ForEachUser(this_01,(Instruction *)def,&local_40);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_40);
  return;
}

Assistant:

void VectorDCE::MarkDebugValueUsesAsDead(
    Instruction* composite, std::vector<Instruction*>* dead_dbg_value) {
  context()->get_def_use_mgr()->ForEachUser(
      composite, [&dead_dbg_value](Instruction* use) {
        if (use->GetCommonDebugOpcode() == CommonDebugInfoDebugValue)
          dead_dbg_value->push_back(use);
      });
}